

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

int ghc::filesystem::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  error_category *peVar4;
  file_status fVar5;
  undefined7 extraout_var;
  file_status extraout_RAX;
  undefined7 extraout_var_00;
  file_status fVar6;
  file_status extraout_RAX_00;
  file_status extraout_RAX_01;
  file_status extraout_RAX_02;
  file_status extraout_RAX_03;
  undefined7 extraout_var_02;
  file_status extraout_RAX_04;
  error_code *in_RCX;
  error_code *nhl;
  uint in_EDX;
  copy_options options;
  time_t *in_R8;
  directory_entry *dst_00;
  directory_iterator iter;
  error_code tec;
  path local_90;
  directory_iterator local_70;
  path local_60;
  file_status local_40;
  error_category *local_38;
  undefined7 extraout_var_01;
  
  local_40._type = none;
  nhl = in_RCX;
  peVar4 = (error_category *)std::_V2::system_category();
  in_RCX->_M_value = 0;
  in_RCX->_M_cat = peVar4;
  local_38 = peVar4;
  if ((in_EDX & 0xb0) == 0) {
    nhl = (error_code *)0x0;
    in_R8 = (time_t *)0x0;
    fVar5 = detail::status_ex(&local_90,(error_code *)dst,(file_status *)in_RCX,(uintmax_t *)0x0,
                              (uintmax_t *)0x0,(time_t *)0x0,0);
  }
  else {
    fVar5 = detail::symlink_status_ex
                      (&local_90,(error_code *)dst,(uintmax_t *)in_RCX,(uintmax_t *)nhl,in_R8);
  }
  uVar1 = (uint)local_90._path._M_dataplus._M_p;
  if ((uint)local_90._path._M_dataplus._M_p < 2) {
    if (in_RCX->_M_value != 0) goto LAB_001573de;
    in_RCX->_M_value = 2;
  }
  else {
    if ((in_EDX & 0xa0) == 0) {
      fVar5 = detail::status_ex(&local_90,(error_code *)src,&local_40,(uintmax_t *)0x0,
                                (uintmax_t *)0x0,(time_t *)0x0,0);
    }
    else {
      fVar5 = detail::symlink_status_ex
                        (&local_90,(error_code *)src,(uintmax_t *)&local_40,(uintmax_t *)nhl,in_R8);
    }
    uVar2 = (uint)local_90._path._M_dataplus._M_p;
    fVar5._type._0_1_ = 4 < uVar1;
    if (((uint)local_90._path._M_dataplus._M_p < 5 && 4 >= uVar1) &&
       (fVar5._type = uVar1 ^ 3, fVar5._4_4_ = 0,
       (uint)local_90._path._M_dataplus._M_p != 2 || fVar5._type != 0)) {
      if (1 < (uint)local_90._path._M_dataplus._M_p) {
        fVar5._type._0_1_ = equivalent((path *)dst,(path *)src,in_RCX);
        fVar5._1_7_ = extraout_var;
        if ((bool)(undefined1)fVar5._type) goto LAB_001573d4;
      }
      options = (copy_options)in_EDX;
      if (uVar1 == 2) {
        if ((in_EDX & 0x40) != 0) goto LAB_001573de;
        if ((char)in_EDX < '\0') {
          bVar3 = path::has_root_directory((path *)dst);
          if (bVar3) {
            local_90._path._M_dataplus._M_p = (pointer)&local_90._path.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
          }
          else {
            canonical(&local_90,(path *)dst,in_RCX);
          }
          detail::create_symlink(&local_90,(path *)src,false,in_RCX);
          fVar5 = (file_status)&local_90._path.field_2;
          local_60._path._M_dataplus._M_p = local_90._path._M_dataplus._M_p;
          if ((file_status)local_90._path._M_dataplus._M_p == fVar5) goto LAB_001573de;
        }
        else {
          if ((in_EDX >> 8 & 1) != 0) {
            detail::create_hardlink((path *)dst,(path *)src,in_RCX);
            fVar5 = extraout_RAX_02;
            goto LAB_001573de;
          }
          if (uVar2 != 3) {
            fVar5._type._0_1_ = copy_file((path *)dst,(path *)src,options,in_RCX);
            fVar5._1_7_ = extraout_var_02;
            goto LAB_001573de;
          }
          path::filename(&local_60,(path *)dst);
          operator/(&local_90,(path *)src,&local_60);
          copy_file((path *)dst,&local_90,options,in_RCX);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._path._M_dataplus._M_p != &local_90._path.field_2) {
            operator_delete(local_90._path._M_dataplus._M_p,
                            local_90._path.field_2._M_allocated_capacity + 1);
          }
          fVar5 = (file_status)&local_60._path.field_2;
          local_90._path.field_2._M_allocated_capacity =
               local_60._path.field_2._M_allocated_capacity;
          if ((file_status)local_60._path._M_dataplus._M_p == fVar5) goto LAB_001573de;
        }
        operator_delete(local_60._path._M_dataplus._M_p,
                        local_90._path.field_2._M_allocated_capacity + 1);
        fVar5 = extraout_RAX_03;
        goto LAB_001573de;
      }
      if (uVar1 != 4) {
        if (uVar1 != 3) goto LAB_001573de;
        if (-1 < (char)in_EDX) {
          fVar5._type._0_1_ = options != none;
          if (options == none || (in_EDX & 8) != 0) {
            if (uVar2 < 2) {
              fVar5._type._0_1_ = create_directory((path *)src,(path *)dst,in_RCX);
              fVar5._1_7_ = extraout_var_00;
              if (in_RCX->_M_value != 0) goto LAB_001573de;
            }
            directory_iterator::directory_iterator(&local_70,(path *)dst,in_RCX);
            while( true ) {
              directory_iterator::directory_iterator((directory_iterator *)&local_90);
              fVar6._type._0_1_ =
                   operator!=(&(local_70._impl.
                                super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_current,(path *)(local_90._path._M_dataplus._M_p + 0x28));
              fVar6._1_7_ = extraout_var_01;
              fVar5 = fVar6;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._path._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_90._path._M_string_length);
                fVar5 = extraout_RAX_00;
              }
              if (!fVar6._type._0_1_) break;
              if (in_RCX->_M_value == 0) {
                dst_00 = &(local_70._impl.
                           super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_dir_entry;
                path::filename(&local_60,&dst_00->_path);
                operator/(&local_90,(path *)src,&local_60);
                copy((EVP_PKEY_CTX *)dst_00,(EVP_PKEY_CTX *)&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._path._M_dataplus._M_p != &local_90._path.field_2) {
                  operator_delete(local_90._path._M_dataplus._M_p,
                                  local_90._path.field_2._M_allocated_capacity + 1);
                }
                fVar5 = (file_status)&local_60._path.field_2;
                if ((file_status)local_60._path._M_dataplus._M_p != fVar5) {
                  operator_delete(local_60._path._M_dataplus._M_p,
                                  local_60._path.field_2._M_allocated_capacity + 1);
                  fVar5 = extraout_RAX_01;
                }
              }
              if (in_RCX->_M_value != 0) break;
              directory_iterator::impl::increment
                        (local_70._impl.
                         super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,in_RCX);
            }
            if (local_70._impl.
                super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_70._impl.
                         super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
              fVar5 = extraout_RAX_04;
            }
          }
          goto LAB_001573de;
        }
        in_RCX->_M_value = 0x15;
        goto LAB_001573da;
      }
      if ((in_EDX & 0x20) != 0) goto LAB_001573de;
      fVar5._type._0_1_ = 1 < uVar2;
      if ((in_EDX & 0x10) != 0 && 1 >= uVar2) {
        copy_symlink((path *)dst,(path *)src,in_RCX);
        fVar5 = extraout_RAX;
        goto LAB_001573de;
      }
    }
LAB_001573d4:
    in_RCX->_M_value = 0x16;
  }
LAB_001573da:
  in_RCX->_M_cat = peVar4;
LAB_001573de:
  return fVar5._type;
}

Assistant:

GHC_INLINE void copy(const path& from, const path& to, copy_options options, std::error_code& ec) noexcept
{
    std::error_code tec;
    file_status fs_from, fs_to;
    ec.clear();
    if ((options & (copy_options::skip_symlinks | copy_options::copy_symlinks | copy_options::create_symlinks)) != copy_options::none) {
        fs_from = symlink_status(from, ec);
    }
    else {
        fs_from = status(from, ec);
    }
    if (!exists(fs_from)) {
        if (!ec) {
            ec = detail::make_error_code(detail::portable_error::not_found);
        }
        return;
    }
    if ((options & (copy_options::skip_symlinks | copy_options::create_symlinks)) != copy_options::none) {
        fs_to = symlink_status(to, tec);
    }
    else {
        fs_to = status(to, tec);
    }
    if (is_other(fs_from) || is_other(fs_to) || (is_directory(fs_from) && is_regular_file(fs_to)) || (exists(fs_to) && equivalent(from, to, ec))) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
    }
    else if (is_symlink(fs_from)) {
        if ((options & copy_options::skip_symlinks) == copy_options::none) {
            if (!exists(fs_to) && (options & copy_options::copy_symlinks) != copy_options::none) {
                copy_symlink(from, to, ec);
            }
            else {
                ec = detail::make_error_code(detail::portable_error::invalid_argument);
            }
        }
    }
    else if (is_regular_file(fs_from)) {
        if ((options & copy_options::directories_only) == copy_options::none) {
            if ((options & copy_options::create_symlinks) != copy_options::none) {
                create_symlink(from.is_absolute() ? from : canonical(from, ec), to, ec);
            }
            else if ((options & copy_options::create_hard_links) != copy_options::none) {
                create_hard_link(from, to, ec);
            }
            else if (is_directory(fs_to)) {
                copy_file(from, to / from.filename(), options, ec);
            }
            else {
                copy_file(from, to, options, ec);
            }
        }
    }
#ifdef LWG_2682_BEHAVIOUR
    else if (is_directory(fs_from) && (options & copy_options::create_symlinks) != copy_options::none) {
        ec = detail::make_error_code(detail::portable_error::is_a_directory);
    }
#endif
    else if (is_directory(fs_from) && (options == copy_options::none || (options & copy_options::recursive) != copy_options::none)) {
        if (!exists(fs_to)) {
            create_directory(to, from, ec);
            if (ec) {
                return;
            }
        }
        for (auto iter = directory_iterator(from, ec); iter != directory_iterator(); iter.increment(ec)) {
            if (!ec) {
                copy(iter->path(), to / iter->path().filename(), options | static_cast<copy_options>(0x8000), ec);
            }
            if (ec) {
                return;
            }
        }
    }
    return;
}